

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

double kj::_::parseDouble(StringPtr *s)

{
  int *piVar1;
  Fault *this;
  bool bVar2;
  double dVar3;
  DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> _kjCondition;
  char *endPtr;
  Fault f_1;
  
  _kjCondition.right = (void *)0x0;
  bVar2 = (s->content).size_ < 2;
  _kjCondition.result = !bVar2;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = s;
  if (bVar2) {
    this = (Fault *)&endPtr;
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::StringPtr_const&,decltype(nullptr)>&,char_const(&)[37],kj::StringPtr_const&>
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
               ,0x252,FAILED,"s != nullptr",
               "_kjCondition,\"String does not contain valid number\", s",&_kjCondition,
               (char (*) [37])"String does not contain valid number",s);
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    dVar3 = anon_unknown_0::NoLocaleStrtod((s->content).ptr,&endPtr);
    _kjCondition.right = (s->content).ptr + ((s->content).size_ - 1);
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.result = endPtr == (char *)_kjCondition.right;
    _kjCondition.op.content.size_ = 5;
    if (_kjCondition.result) {
      return dVar3;
    }
    this = &f_1;
    _kjCondition.left = (StringPtr *)&endPtr;
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char_const*>&,char_const(&)[46],kj::StringPtr_const&>
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
               ,0x256,FAILED,"endPtr == s.end()",
               "_kjCondition,\"String does not contain valid floating number\", s",
               (DebugComparison<char_*&,_const_char_*> *)&_kjCondition,
               (char (*) [46])"String does not contain valid floating number",s);
  }
  Debug::Fault::~Fault(this);
  return 0.0;
}

Assistant:

double parseDouble(const StringPtr& s) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = _::NoLocaleStrtod(s.begin(), &endPtr);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid floating number", s) { return 0; }
#if _WIN32 || __CYGWIN__ || __BIONIC__
  // When Windows' strtod() parses "nan", it returns a value with the sign bit set. But, our
  // preferred canonical value for NaN does not have the sign bit set, and all other platforms
  // return one without the sign bit set. So, on Windows, detect NaN and return our preferred
  // version.
  //
  // Cygwin seemingly does not try to emulate Linux behavior here, but rather allows Windows'
  // behavior to leak through. (Conversely, WINE actually produces the Linux behavior despite
  // trying to behave like Win32...)
  //
  // Bionic (Android) failed the unit test and so I added it to the list without investigating
  // further.
  if (isNaN(value)) {
    // NaN
    return kj::nan();
  }
#endif
  return value;
}